

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O2

void __thiscall
chrono::ChFile_ps::DrawGraphXY(ChFile_ps *this,ChArray<> *Yvalues,ChArray<> *Xvalues)

{
  double dVar1;
  uint uVar2;
  CoeffReturnType pdVar3;
  uint uVar4;
  ulong index;
  ChVector2<double> local_78;
  ChVector2<double> local_68;
  ChVector2<double> local_58;
  double local_48;
  double dStack_40;
  
  GrSave(this);
  ClipToGraph(this);
  uVar4 = (uint)(Xvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  uVar2 = (uint)(Yvalues->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows;
  if ((int)uVar2 < (int)uVar4) {
    uVar4 = uVar2;
  }
  if (uVar4 != 0) {
    StartLine(this);
    for (index = 0; (~((int)uVar4 >> 0x1f) & uVar4) != index; index = index + 1) {
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)Xvalues,index
                         );
      dVar1 = *pdVar3;
      pdVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)Yvalues,index
                         );
      local_78.m_data[1] = *pdVar3;
      local_78.m_data[0] = dVar1;
      To_page_from_graph(this,&local_78);
      if (index == 0) {
        local_58.m_data[0] = local_48;
        local_58.m_data[1] = dStack_40;
        MoveTo(this,&local_58);
      }
      else {
        local_68.m_data[0] = local_48;
        local_68.m_data[1] = dStack_40;
        AddLinePoint(this,&local_68);
      }
    }
    PaintStroke(this);
    GrRestore(this);
    return;
  }
  return;
}

Assistant:

void ChFile_ps::DrawGraphXY(const ChArray<>& Yvalues, const ChArray<>& Xvalues) {
    // Set clip region
    GrSave();
    ClipToGraph();

    int points = std::min((int)Xvalues.size(), (int)Yvalues.size());
    if (points == 0)
        return;

    StartLine();
    ChVector2<> mp;
    for (int i = 0; i < points; i++) {
        mp.x() = Xvalues(i);
        mp.y() = Yvalues(i);
        mp = To_page_from_graph(mp);
        if (i == 0)
            MoveTo(mp);
        else
            AddLinePoint(mp);
    }
    PaintStroke();

    GrRestore();
}